

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

int png_crc_error(png_structrp png_ptr)

{
  uint uVar1;
  undefined8 in_RAX;
  bool bVar2;
  png_byte crc_bytes [4];
  
  crc_bytes = SUB84((ulong)in_RAX >> 0x20,0);
  bVar2 = (~png_ptr->flags & 0x300) == 0;
  if ((png_ptr->chunk_name >> 0x1d & 1) == 0) {
    bVar2 = (bool)((byte)(png_ptr->flags >> 0xb) & 1);
  }
  png_ptr->io_state = 0x81;
  png_read_data(png_ptr,crc_bytes,4);
  uVar1 = 0;
  if (bVar2 == false) {
    uVar1 = (uint)(((uint)crc_bytes >> 0x18 | ((uint)crc_bytes & 0xff0000) >> 8 |
                    ((uint)crc_bytes & 0xff00) << 8 | (int)crc_bytes << 0x18) != png_ptr->crc);
  }
  return uVar1;
}

Assistant:

int /* PRIVATE */
png_crc_error(png_structrp png_ptr)
{
   png_byte crc_bytes[4];
   png_uint_32 crc;
   int need_crc = 1;

   if (PNG_CHUNK_ANCILLARY(png_ptr->chunk_name) != 0)
   {
      if ((png_ptr->flags & PNG_FLAG_CRC_ANCILLARY_MASK) ==
          (PNG_FLAG_CRC_ANCILLARY_USE | PNG_FLAG_CRC_ANCILLARY_NOWARN))
         need_crc = 0;
   }

   else /* critical */
   {
      if ((png_ptr->flags & PNG_FLAG_CRC_CRITICAL_IGNORE) != 0)
         need_crc = 0;
   }

#ifdef PNG_IO_STATE_SUPPORTED
   png_ptr->io_state = PNG_IO_READING | PNG_IO_CHUNK_CRC;
#endif

   /* The chunk CRC must be serialized in a single I/O call. */
   png_read_data(png_ptr, crc_bytes, 4);

   if (need_crc != 0)
   {
      crc = png_get_uint_32(crc_bytes);
      return crc != png_ptr->crc;
   }

   else
      return 0;
}